

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O2

void x86_64_rshi(dill_stream s,int dest,int src,int imm)

{
  if (dest != src) {
    x86_64_pmov(s,6,dest,src);
  }
  BYTE_OUT3R(s,dest < 8 ^ 9,0xc1,dest & 7U | 0xe8,imm & 0xff);
  return;
}

Assistant:

static void
x86_64_rshi(dill_stream s, int dest, int src, int imm)
{
    int rex = REX_W;
    if (dest != src) {
        x86_64_movl(s, dest, src);
    }
    if (dest > RDI)
        rex |= REX_B;
    BYTE_OUT3R(s, rex, 0xc1, ModRM(0x3, 0x5, dest), imm & 0xff);
}